

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_structs.hpp
# Opt level: O0

bool operator==(Derived2 *x,Derived2 *y)

{
  __type _Var1;
  int *in_RSI;
  int *in_RDI;
  bool local_11;
  
  local_11 = false;
  if ((*in_RDI == *in_RSI) && (local_11 = false, in_RDI[1] == in_RSI[1])) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)y);
    local_11 = false;
    if ((_Var1) && (local_11 = false, in_RDI[10] == in_RSI[10])) {
      local_11 = in_RDI[0xb] == in_RSI[0xb];
    }
  }
  return local_11;
}

Assistant:

bool operator==(const Derived2& x, const Derived2& y)
  {
    return x.a == y.a
      &&   x.b == y.b
      &&   x.c == y.c
      &&   x.d == y.d
      &&   x.e == y.e;
  }